

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts int_to_float(int64_t a,int scale,float_status *status)

{
  FloatParts FVar1;
  int iVar2;
  long local_50;
  int local_48;
  int local_44;
  int local_40;
  uint64_t uStack_38;
  int shift;
  uint64_t f;
  float_status *status_local;
  int scale_local;
  int64_t a_local;
  FloatParts r;
  
  memset(&a_local,0,0x10);
  if (a == 0) {
    r.frac._4_1_ = 1;
  }
  else {
    r.frac._4_1_ = 2;
    uStack_38 = a;
    if (a < 0) {
      uStack_38 = -a;
      r.frac._5_1_ = 1;
    }
    iVar2 = clz64(uStack_38);
    iVar2 = iVar2 + -1;
    local_40 = scale;
    if (scale < -0xffff) {
      local_40 = -0x10000;
    }
    if (local_40 < 0x10000) {
      local_44 = scale;
      if (scale < -0xffff) {
        local_44 = -0x10000;
      }
      local_48 = local_44;
    }
    else {
      local_48 = 0x10000;
    }
    r.frac._0_4_ = (0x3e - iVar2) + local_48;
    if (iVar2 < 0) {
      local_50 = 0x4000000000000000;
    }
    else {
      local_50 = uStack_38 << ((byte)iVar2 & 0x3f);
    }
    a_local = local_50;
  }
  FVar1.exp = (int)r.frac;
  FVar1.frac = a_local;
  FVar1.cls = r.frac._4_1_;
  FVar1.sign = (_Bool)r.frac._5_1_;
  FVar1._14_2_ = r.frac._6_2_;
  return FVar1;
}

Assistant:

static FloatParts int_to_float(int64_t a, int scale, float_status *status)
{
    FloatParts r = { .sign = false };

    if (a == 0) {
        r.cls = float_class_zero;
    } else {
        uint64_t f = a;
        int shift;

        r.cls = float_class_normal;
        if (a < 0) {
#ifdef _MSC_VER
            f = 0ULL - f;
#else
            f = -f;
#endif
            r.sign = true;
        }
        shift = clz64(f) - 1;
        scale = MIN(MAX(scale, -0x10000), 0x10000);

        r.exp = DECOMPOSED_BINARY_POINT - shift + scale;
        r.frac = (shift < 0 ? DECOMPOSED_IMPLICIT_BIT : f << shift);
    }

    return r;
}